

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitstreamDecoder.cpp
# Opt level: O2

void scan_bitstream_ace(TrackData *trackdata)

{
  bool bVar1;
  uint8_t uVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  BitBuffer *this;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int i;
  int iVar10;
  uint8_t data;
  uint local_cc;
  TrackData *local_c8;
  int local_bc;
  Data block;
  Header local_a0;
  Track track;
  Sector sector;
  
  this = TrackData::bitstream(trackdata);
  iVar5 = 0;
  BitBuffer::seek(this,0);
  Track::Track(&track,0);
  track.tracklen = BitBuffer::track_bitsize(this);
  block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_bc = 0;
  uVar8 = 0;
LAB_0014ba18:
  uVar9 = 0;
LAB_0014ba1b:
  while( true ) {
    bVar1 = BitBuffer::wrapped(this);
    if (bVar1) {
      if (iVar5 != 2) goto LAB_0014bcee;
      goto LAB_0014bc48;
    }
    uVar2 = BitBuffer::read1(this);
    bVar3 = BitBuffer::read1(this);
    if (((bVar3 | uVar2 * '\x02') & 2) != 0) break;
    BitBuffer::read1(this);
  }
  if ((bVar3 & 1) == 0) goto code_r0x0014ba5c;
  data = '\0';
  uVar6 = 0;
  uVar9 = 1;
  uVar7 = 2;
  local_cc = uVar8;
  local_c8 = trackdata;
  for (iVar10 = 0; trackdata = local_c8, uVar8 = local_cc, iVar10 != 10; iVar10 = iVar10 + 1) {
    bVar3 = BitBuffer::read1(this);
    bVar4 = BitBuffer::read1(this);
    uVar6 = ~(uint)bVar4 & 1;
    uVar9 = uVar9 ^ uVar6;
    uVar7 = uVar7 & ((uint)bVar3 * 2 | (uint)bVar4);
    data = (byte)(uVar6 << ((byte)iVar10 & 0x1f)) | data;
  }
  if ((uVar6 == 0 || uVar7 == 0) || uVar9 == 0) goto LAB_0014bb0f;
  if (iVar5 == 1) {
    if (data == 0xff) {
LAB_0014bba4:
      iVar5 = 1;
      goto LAB_0014bc2a;
    }
    if (data != '*') goto LAB_0014bb71;
    iVar5 = BitBuffer::tell(this);
    local_bc = BitBuffer::track_offset(this,iVar5);
    goto LAB_0014bbe4;
  }
  if (iVar5 == 0) {
    if (data == 0xff) goto LAB_0014bba4;
LAB_0014bb71:
    iVar5 = 0;
    if (block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
  }
  goto LAB_0014bc2a;
code_r0x0014ba5c:
  bVar1 = 0x3f < uVar9;
  uVar9 = uVar9 + 1;
  if (bVar1 && iVar5 == 2) {
LAB_0014bc48:
    iVar5 = SizeToCode(0x1000);
    Header::Header(&local_a0,&trackdata->cylhead,0,iVar5);
    Sector::Sector(&sector,_250K,Ace,&local_a0,0);
    sector.offset = local_bc;
    bVar1 = IsValidDeepThoughtData(&block);
    if (!bVar1) {
      local_a0._0_8_ = CH((trackdata->cylhead).cyl,(trackdata->cylhead).head);
      Message<char_const*>(msgWarning,"block checksum error on %s",(char **)&local_a0);
      uVar8 = 1;
    }
    Sector::add(&sector,&block,(bool)((byte)uVar8 & 1),'\0');
    Track::add(&track,&sector);
    std::vector<Data,_std::allocator<Data>_>::~vector(&sector.m_data);
LAB_0014bcee:
    TrackData::add(trackdata,&track);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&block);
    std::vector<Sector,_std::allocator<Sector>_>::~vector(&track.m_sectors);
    return;
  }
  goto LAB_0014ba1b;
LAB_0014bb0f:
  if (iVar5 == 2) {
    if (((local_cc & 1) == 0) || (opt.verbose != 0)) {
      if (uVar6 == 0 || uVar7 == 0) {
        local_a0.cyl = (int)block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                       (int)block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
        sector.header._0_8_ = CH((local_c8->cylhead).cyl,(local_c8->cylhead).head);
        Message<int,char_const*>
                  (msgWarning,"framing error at offset %u on on %s",&local_a0.cyl,(char **)&sector);
        uVar8 = 1;
LAB_0014bbe4:
        iVar5 = 2;
      }
      else {
        if (uVar9 == 0) {
          local_a0.cyl = (int)block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                         (int)block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start;
          sector.header._0_8_ = CH((local_c8->cylhead).cyl,(local_c8->cylhead).head);
          Message<int,char_const*>
                    (msgWarning,"parity error at offset %u on on %s",&local_a0.cyl,(char **)&sector)
          ;
        }
        iVar5 = 2;
        uVar8 = 1;
      }
    }
    else {
      iVar5 = 2;
    }
LAB_0014bc2a:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (&block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&data);
  }
  goto LAB_0014ba18;
}

Assistant:

void scan_bitstream_ace(TrackData& trackdata)
{
    auto& bitbuf = trackdata.bitstream();
    bitbuf.seek(0);

    Track track;
    track.tracklen = bitbuf.track_bitsize();

    uint32_t word = 0;

    enum State { stateWant255, stateWant42, stateData };
    State state = stateWant255;
    Data block;
    int idle = 0;
    bool dataerror = false;
    int bit;
    int data_offset = 0;

    while (!bitbuf.wrapped())
    {
        // Read the next clock and data bits
        word = (bitbuf.read1() << 1) | bitbuf.read1();

        // If the clock is missing, attempt to re-sync by skipping a bit
        if (!(word & 2))
        {
            bitbuf.read1();
            continue;
        }

        // Outside a frame a 1 represents the idle state
        if (~word & 1)
        {
            // Stop if we've found an idle patch after valid data
            if (++idle > 64 && state == stateData)
                break;

            // Ignore idle otherwise
            continue;
        }

        // The transition to 0 represents a potential start bit, so reset the idle count
        idle = 0;

        bit = 0;
        uint8_t data = 0;   // no data yet
        int parity = 1;     // odd parity
        int clock = 2;      // valid clock

        // Read 8 data bits, 1 parity bit, 1 stop bit
        for (int i = 0; i < 10; ++i)
        {
            // Fetch clock and data bits
            word = (bitbuf.read1() << 1) | bitbuf.read1();

            // Extract bit, update parity and clock status
            bit = ~word & 1;
            parity ^= bit;
            clock &= word;

            // Add data bit (lsb to msb order)
            data |= (bit << i) & 0xff;

        }

        // Check for errors
        if (!clock || !bit || !parity)
        {
            if (state != stateData)
                continue;

            // Report only first error during the data block, unless verbose
            if (!dataerror || opt.verbose)
            {
                dataerror = true;

                if (!clock || !bit)
                    Message(msgWarning, "framing error at offset %u on on %s", block.size(), CH(trackdata.cylhead.cyl, trackdata.cylhead.head));
                else if (!parity) // inverted due to inclusion of stop bit above
                    Message(msgWarning, "parity error at offset %u on on %s", block.size(), CH(trackdata.cylhead.cyl, trackdata.cylhead.head));
            }
        }
        else
        {
            switch (state)
            {
            case stateWant255:
                if (data == 255)
                    state = stateWant42;
                else
                    block.clear();
                break;

            case stateWant42:
                if (data == 42)
                {
                    state = stateData;
                    data_offset = bitbuf.track_offset(bitbuf.tell());
                }
                else if (data != 255)
                {
                    state = stateWant255;
                    block.clear();
                }
                break;

            default:
                break;
            }
        }

        // Save the byte
        block.push_back(data);
    }

    // If we found a block on the track, save it in a 4K sector with id=0.
    if (state == stateData)
    {
        Sector sector(DataRate::_250K, Encoding::Ace, Header(trackdata.cylhead, 0, SizeToCode(4096)));
        sector.offset = data_offset;

        // Skip header bytes
        if (!IsValidDeepThoughtData(block))
        {
            Message(msgWarning, "block checksum error on %s", CH(trackdata.cylhead.cyl, trackdata.cylhead.head));
            dataerror = true;
        }

        sector.add(std::move(block), dataerror, 0x00);
        track.add(std::move(sector));
    }

    trackdata.add(std::move(track));
}